

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Queue.h
# Opt level: O2

void __thiscall rtb::Concurrency::Queue<int>::~Queue(Queue<int> *this)

{
  std::condition_variable::~condition_variable(&this->cond_);
  std::
  _Rb_tree<std::thread::id,_std::pair<const_std::thread::id,_int>,_std::_Select1st<std::pair<const_std::thread::id,_int>_>,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
  ::~_Rb_tree(&(this->subscribersMissingRead_)._M_t);
  std::
  _Rb_tree<std::thread::id,_std::pair<const_std::thread::id,_std::_List_iterator<std::optional<int>_>_>,_std::_Select1st<std::pair<const_std::thread::id,_std::_List_iterator<std::optional<int>_>_>_>,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_std::_List_iterator<std::optional<int>_>_>_>_>
  ::~_Rb_tree(&(this->subscribersNextRead_)._M_t);
  std::__cxx11::_List_base<std::optional<int>,_std::allocator<std::optional<int>_>_>::_M_clear
            ((_List_base<std::optional<int>,_std::allocator<std::optional<int>_>_> *)this);
  return;
}

Assistant:

Queue() = default;